

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall
FlowGraph::InsertCompBlockToLoopList
          (FlowGraph *this,Loop *loop,BasicBlock *compBlock,BasicBlock *targetBlock,bool postTarget)

{
  bool bVar1;
  Type *ppBVar2;
  BasicBlock **loopBlock;
  EditingIterator iter;
  bool found;
  bool postTarget_local;
  BasicBlock *targetBlock_local;
  BasicBlock *compBlock_local;
  Loop *loop_local;
  FlowGraph *this_local;
  
  if (loop != (Loop *)0x0) {
    iter.super_EditingIterator.last._6_1_ = 0;
    iter.super_EditingIterator.last._7_1_ = postTarget;
    targetBlock_local = compBlock;
    compBlock_local = (BasicBlock *)loop;
    loop_local = (Loop *)this;
    SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
              ((EditingIterator *)&loopBlock,&loop->blockList);
    do {
      bVar1 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                        ((EditingIterator *)&loopBlock);
      if (!bVar1) goto LAB_005377fe;
      ppBVar2 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&loopBlock);
    } while (((*(ushort *)&(*ppBVar2)->field_0x18 & 1) != 0) || (*ppBVar2 != targetBlock));
    iter.super_EditingIterator.last._6_1_ = 1;
LAB_005377fe:
    if ((iter.super_EditingIterator.last._6_1_ & 1) != 0) {
      if ((iter.super_EditingIterator.last._7_1_ & 1) != 0) {
        SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                  ((EditingIterator *)&loopBlock);
      }
      SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::InsertBefore
                ((EditingIterator *)&loopBlock,&targetBlock_local);
    }
    InsertCompBlockToLoopList
              (this,(Loop *)compBlock_local->slotDeadStoreCandidates,targetBlock_local,targetBlock,
               (bool)(iter.super_EditingIterator.last._7_1_ & 1));
  }
  return;
}

Assistant:

void
FlowGraph::InsertCompBlockToLoopList(Loop *loop, BasicBlock* compBlock, BasicBlock* targetBlock, bool postTarget)
{
    if (loop)
    {
        bool found = false;
        FOREACH_BLOCK_IN_LOOP_EDITING(loopBlock, loop, iter)
        {
            if (loopBlock == targetBlock)
            {
                found = true;
                break;
            }
        } NEXT_BLOCK_IN_LOOP_EDITING;
        if (found)
        {
            if (postTarget)
            {
                iter.Next();
            }
            iter.InsertBefore(compBlock);
        }
        InsertCompBlockToLoopList(loop->parent, compBlock, targetBlock, postTarget);
    }
}